

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManSupports(Aig_Man_t *pMan)

{
  Part_One_t *p2;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 aVar1;
  int iVar2;
  long *plVar3;
  Part_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  Part_One_t *pPVar5;
  Vec_Int_t *p_02;
  Part_One_t *pPVar6;
  undefined8 *puVar7;
  int local_44;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Part_One_t *pPart1;
  Part_One_t *pPart0;
  Part_Man_t *p;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vSupports;
  Aig_Man_t *pMan_local;
  
  for (local_44 = 0; iVar2 = Vec_PtrSize(pMan->vCis), local_44 < iVar2; local_44 = local_44 + 1) {
    plVar3 = (long *)Vec_PtrEntry(pMan->vCis,local_44);
    *plVar3 = (long)local_44;
  }
  for (local_44 = 0; iVar2 = Vec_PtrSize(pMan->vCos), local_44 < iVar2; local_44 = local_44 + 1) {
    plVar3 = (long *)Vec_PtrEntry(pMan->vCos,local_44);
    *plVar3 = (long)local_44;
  }
  p_00 = Part_ManStart(0x100000,0x40);
  iVar2 = Aig_ManCoNum(pMan);
  p_01 = Vec_PtrAlloc(iVar2);
  Aig_ManCleanData(pMan);
  local_44 = 0;
  do {
    iVar2 = Vec_PtrSize(pMan->vObjs);
    if (iVar2 <= local_44) {
      Part_ManStop(p_00);
      Vec_VecSort((Vec_Vec_t *)p_01,1);
      for (local_44 = 0; iVar2 = Vec_PtrSize(pMan->vCis), local_44 < iVar2; local_44 = local_44 + 1)
      {
        puVar7 = (undefined8 *)Vec_PtrEntry(pMan->vCis,local_44);
        *puVar7 = 0;
      }
      for (local_44 = 0; iVar2 = Vec_PtrSize(pMan->vCos), local_44 < iVar2; local_44 = local_44 + 1)
      {
        puVar7 = (undefined8 *)Vec_PtrEntry(pMan->vCos,local_44);
        *puVar7 = 0;
      }
      return p_01;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,local_44);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar2 = Aig_ObjIsNode(pObj_00);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsCo(pObj_00);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsCi(pObj_00);
          if (iVar2 == 0) {
            iVar2 = Aig_ObjIsConst1(pObj_00);
            if (iVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0x14f,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
            }
            if ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) != 0) {
              pPVar6 = Part_ManFetchEntry(p_00,0,(uint)(*(ulong *)&pObj_00->field_0x18 >> 6) &
                                                 0x3ffffff);
              (pObj_00->field_5).pData = pPVar6;
            }
          }
          else if ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) != 0) {
            pPVar6 = Part_ManFetchEntry(p_00,1,(uint)(*(ulong *)&pObj_00->field_0x18 >> 6) &
                                               0x3ffffff);
            aVar1 = pObj_00->field_0;
            iVar2 = pPVar6->nOuts;
            pPVar6->nOuts = iVar2 + 1;
            (&pPVar6[1].nRefs)[iVar2] = aVar1.CioId;
            (pObj_00->field_5).pData = pPVar6;
          }
        }
        else {
          pAVar4 = Aig_ObjFanin0(pObj_00);
          pPVar6 = (Part_One_t *)(pAVar4->field_5).pData;
          p_02 = Part_ManTransferEntry(pPVar6);
          Vec_IntPush(p_02,(pObj_00->field_0).CioId);
          Vec_PtrPush(p_01,p_02);
          if (pPVar6->nRefs < 1) {
            __assert_fail("pPart0->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x13a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
          iVar2 = pPVar6->nRefs + -1;
          pPVar6->nRefs = iVar2;
          if (iVar2 == 0) {
            Part_ManRecycleEntry(p_00,pPVar6);
          }
        }
      }
      else {
        pAVar4 = Aig_ObjFanin0(pObj_00);
        pPVar6 = (Part_One_t *)(pAVar4->field_5).pData;
        pAVar4 = Aig_ObjFanin1(pObj_00);
        p2 = (Part_One_t *)(pAVar4->field_5).pData;
        pPVar5 = Part_ManMergeEntry(p_00,pPVar6,p2,
                                    (uint)(*(ulong *)&pObj_00->field_0x18 >> 6) & 0x3ffffff);
        (pObj_00->field_5).pData = pPVar5;
        if (pPVar6->nRefs < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                        ,0x12a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
        }
        iVar2 = pPVar6->nRefs + -1;
        pPVar6->nRefs = iVar2;
        if (iVar2 == 0) {
          Part_ManRecycleEntry(p_00,pPVar6);
        }
        if (p2->nRefs < 1) {
          __assert_fail("pPart1->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                        ,0x12d,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
        }
        iVar2 = p2->nRefs + -1;
        p2->nRefs = iVar2;
        if (iVar2 == 0) {
          Part_ManRecycleEntry(p_00,p2);
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManSupports( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupports;
    Vec_Int_t * vSupp;
    Part_Man_t * p;
    Part_One_t * pPart0, * pPart1;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // set the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    // start the support computation manager
    p = Part_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Aig_ManCoNum(pMan) );
    Aig_ManCleanData(pMan);
    Aig_ManForEachObj( pMan, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            pPart1 = (Part_One_t *)Aig_ObjFanin1(pObj)->pData;
            pObj->pData = Part_ManMergeEntry( p, pPart0, pPart1, pObj->nRefs );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart1 );
            if ( ((Part_One_t *)pObj->pData)->nOuts <= 16 )
                Counter++;
            continue;
        }
        if ( Aig_ObjIsCo(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            vSupp = Part_ManTransferEntry(pPart0);
            Vec_IntPush( vSupp, (int)(long)pObj->pNext );
            Vec_PtrPush( vSupports, vSupp );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Aig_ObjIsCi(pObj) )
        {
            if ( pObj->nRefs )
            {
                pPart0 = Part_ManFetchEntry( p, 1, pObj->nRefs );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(long)pObj->pNext;
                pObj->pData = pPart0;
            }
            continue;
        }
        if ( Aig_ObjIsConst1(pObj) )
        {
            if ( pObj->nRefs )
                pObj->pData = Part_ManFetchEntry( p, 0, pObj->nRefs );
            continue;
        }
        assert( 0 );
    }
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Part_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = NULL;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = NULL;
/*
    Aig_ManForEachCo( pMan, pObj, i )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vSupports, i) ) );
    printf( "\n" );
*/
//    printf( "%d \n", Counter );
    return vSupports;
}